

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  undefined8 local_98;
  undefined8 uStack_90;
  mbedtls_md5_context local_88;
  
  mbedtls_md5_init(&local_88);
  iVar2 = mbedtls_md5_starts_ret(&local_88);
  if ((((iVar2 == 0) && (iVar2 = mbedtls_md5_update_ret(&local_88,pwd,pwdlen), iVar2 == 0)) &&
      (iVar2 = mbedtls_md5_update_ret(&local_88,iv,8), iVar2 == 0)) &&
     (iVar2 = mbedtls_md5_finish_ret(&local_88,(uchar *)&local_98), iVar2 == 0)) {
    if (0x10 < keylen) {
      *(undefined8 *)key = local_98;
      *(undefined8 *)(key + 8) = uStack_90;
      iVar2 = mbedtls_md5_starts_ret(&local_88);
      if (((iVar2 != 0) ||
          (iVar2 = mbedtls_md5_update_ret(&local_88,(uchar *)&local_98,0x10), iVar2 != 0)) ||
         ((iVar2 = mbedtls_md5_update_ret(&local_88,pwd,pwdlen), iVar2 != 0 ||
          ((iVar2 = mbedtls_md5_update_ret(&local_88,iv,8), iVar2 != 0 ||
           (iVar2 = mbedtls_md5_finish_ret(&local_88,(uchar *)&local_98), iVar2 != 0))))))
      goto LAB_001322c8;
      sVar1 = keylen - 0x10;
      bVar4 = keylen < 0x20;
      keylen = 0x10;
      if (bVar4) {
        keylen = sVar1;
      }
      key = key + 0x10;
    }
    memcpy(key,&local_98,keylen);
    iVar2 = 0;
  }
LAB_001322c8:
  mbedtls_md5_free(&local_88);
  lVar3 = 0;
  do {
    *(undefined1 *)((long)&local_98 + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return iVar2;
}

Assistant:

static int pem_pbkdf1( unsigned char *key, size_t keylen,
                       unsigned char *iv,
                       const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;
    int ret;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv,  8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );
        goto exit;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, md5sum, 16 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

exit:
    mbedtls_md5_free( &md5_ctx );
    mbedtls_zeroize( md5sum, 16 );

    return( ret );
}